

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fsg_model.c
# Opt level: O3

int fsg_model_add_silence(fsg_model_t *fsg,char *silword,int state,float32 silprob)

{
  float fVar1;
  int wid;
  int iVar2;
  int iVar3;
  bitvec_t *pbVar4;
  uint from;
  int iVar5;
  
  err_msg(ERR_INFO,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/fsg_model.c"
          ,0x195,"Adding silence transitions for %s to FSG\n",silword);
  wid = fsg_model_word_add(fsg,silword);
  iVar2 = logmath_log(fsg->lmath,(float64)(double)(float)silprob);
  fVar1 = (float)fsg->lw;
  pbVar4 = fsg->silwords;
  if (pbVar4 == (bitvec_t *)0x0) {
    iVar5 = fsg->n_word_alloc + 0x1f;
    iVar3 = fsg->n_word_alloc + 0x3e;
    if (-1 < iVar5) {
      iVar3 = iVar5;
    }
    pbVar4 = (bitvec_t *)
             __ckd_calloc__((long)(iVar3 >> 5),4,
                            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/fsg_model.c"
                            ,0x19a);
    fsg->silwords = pbVar4;
  }
  iVar5 = (int)((float)iVar2 * fVar1);
  iVar2 = wid + 0x1f;
  if (-1 < wid) {
    iVar2 = wid;
  }
  pbVar4[iVar2 >> 5] = pbVar4[iVar2 >> 5] | 1 << ((byte)wid & 0x1f);
  if (state == -1) {
    if (fsg->n_state < 1) {
      from = 0;
    }
    else {
      from = 0;
      do {
        fsg_model_trans_add(fsg,from,from,iVar5,wid);
        from = from + 1;
      } while ((int)from < fsg->n_state);
    }
  }
  else {
    fsg_model_trans_add(fsg,state,state,iVar5,wid);
    from = 1;
  }
  err_msg(ERR_INFO,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/fsg_model.c"
          ,0x1a9,"Added %d silence word transitions\n",(ulong)from);
  return from;
}

Assistant:

int
fsg_model_add_silence(fsg_model_t * fsg, char const *silword,
                      int state, float32 silprob)
{
    int32 logsilp;
    int n_trans, silwid, src;

    E_INFO("Adding silence transitions for %s to FSG\n", silword);

    silwid = fsg_model_word_add(fsg, silword);
    logsilp = (int32) (logmath_log(fsg->lmath, silprob) * fsg->lw);
    if (fsg->silwords == NULL)
        fsg->silwords = bitvec_alloc(fsg->n_word_alloc);
    bitvec_set(fsg->silwords, silwid);

    n_trans = 0;
    if (state == -1) {
        for (src = 0; src < fsg->n_state; src++) {
            fsg_model_trans_add(fsg, src, src, logsilp, silwid);
            ++n_trans;
        }
    }
    else {
        fsg_model_trans_add(fsg, state, state, logsilp, silwid);
        ++n_trans;
    }

    E_INFO("Added %d silence word transitions\n", n_trans);
    return n_trans;
}